

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

void GetDifferenceInternal
               (S2CellId cell,S2CellUnion *y,vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids)

{
  bool bVar1;
  int local_3c;
  S2CellId SStack_38;
  int i;
  S2CellId child;
  vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids_local;
  S2CellUnion *y_local;
  S2CellId cell_local;
  
  y_local = (S2CellUnion *)cell.id_;
  bVar1 = S2CellUnion::Intersects(y,cell);
  if (bVar1) {
    child.id_ = (uint64)y_local;
    bVar1 = S2CellUnion::Contains(y,(S2CellId)y_local);
    if (!bVar1) {
      SStack_38 = S2CellId::child_begin((S2CellId *)&y_local);
      for (local_3c = 0; GetDifferenceInternal(SStack_38,y,cell_ids), local_3c != 3;
          local_3c = local_3c + 1) {
        SStack_38 = S2CellId::next(&stack0xffffffffffffffc8);
      }
    }
  }
  else {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(cell_ids,(value_type *)&y_local);
  }
  return;
}

Assistant:

static void GetDifferenceInternal(S2CellId cell,
                                  const S2CellUnion& y,
                                  vector<S2CellId>* cell_ids) {
  // Add the difference between cell and y to cell_ids.
  // If they intersect but the difference is non-empty, divide and conquer.
  if (!y.Intersects(cell)) {
    cell_ids->push_back(cell);
  } else if (!y.Contains(cell)) {
    S2CellId child = cell.child_begin();
    for (int i = 0; ; ++i) {
      GetDifferenceInternal(child, y, cell_ids);
      if (i == 3) break;  // Avoid unnecessary next() computation.
      child = child.next();
    }
  }
}